

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

bool QMetaType::canConvert(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  __atomic_base<int> _Var6;
  QMetaTypeModuleHelper **ppQVar7;
  Type *this;
  function<bool_(const_void_*,_void_*)> *pfVar8;
  anon_struct_8_1_2f67eb89 *this_00;
  __atomic_base<int> _Var9;
  ulong uVar10;
  long in_FS_OFFSET;
  QMetaType local_48;
  QMetaType local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    uVar3 = 0;
    if ((fromType.d_ptr != (QMetaTypeInterface *)0x0) &&
       (uVar3 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i, uVar3 == 0)) {
      uVar3 = registerHelper(fromType.d_ptr);
    }
    if (toType.d_ptr == (QMetaTypeInterface *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar4 = ((toType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      uVar10 = (ulong)uVar4;
      if (uVar4 == 0) {
        uVar4 = registerHelper(toType.d_ptr);
        uVar10 = (ulong)uVar4;
      }
    }
    bVar1 = false;
    if (((uVar3 == 0) || (_Var9._M_i = (__int_type_conflict)uVar10, _Var9._M_i == 0)) ||
       (bVar1 = true, uVar3 == _Var9._M_i)) goto LAB_00296923;
    _Var6._M_i = _Var9._M_i;
    if (_Var9._M_i < (int)uVar3) {
      _Var6._M_i = uVar3;
    }
    this_00 = &metatypeHelper;
    if (0x3f < _Var6._M_i) {
      if (_Var6._M_i - 0x1000U < 0x18) {
        ppQVar7 = &qMetaTypeGuiHelper;
      }
      else {
        if (_Var6._M_i != 0x2000) {
          this_00 = (anon_struct_8_1_2f67eb89 *)0x0;
          goto LAB_00296892;
        }
        ppQVar7 = &qMetaTypeWidgetsHelper;
      }
      this_00 = (anon_struct_8_1_2f67eb89 *)*ppQVar7;
    }
LAB_00296892:
    if (((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
          *)this_00 !=
         (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
          *)0x0) &&
       (iVar5 = (*(*(_func_int ***)this_00)[1])(this_00,0,(ulong)uVar3,0,uVar10),
       (char)iVar5 != '\0')) goto LAB_00296923;
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
           ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                         *)this_00);
    pfVar8 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
             ::function(this,(pair<int,_int>)((ulong)uVar3 | uVar10 << 0x20));
    if (pfVar8 != (function<bool_(const_void_*,_void_*)> *)0x0) goto LAB_00296923;
    _Var6._M_i = (__int_type_conflict)
                 QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType.typeId;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      _Var6._M_i = registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::
                                   metaType);
    }
    if (_Var9._M_i != _Var6._M_i) {
      _Var6._M_i = (__int_type_conflict)
                   QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType.typeId.
                   _q_value.super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        _Var6._M_i = registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::
                                     metaType);
      }
      if (_Var9._M_i == _Var6._M_i) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          bVar1 = canConvertToAssociativeIterable(fromType);
          return bVar1;
        }
        goto LAB_00296ac3;
      }
      if (_Var9._M_i < 0x1c) {
        if (_Var9._M_i == 8) {
LAB_002969d0:
          bVar2 = canConvert(fromType,(QMetaType)0x6be858);
          if (!bVar2) goto LAB_002969e7;
          goto LAB_00296923;
        }
        if ((_Var9._M_i == 9) && (bVar2 = canConvert(fromType,(QMetaType)0x6be7e8), bVar2))
        goto LAB_00296923;
      }
      else {
        if (_Var9._M_i == 0x1c) goto LAB_002969d0;
LAB_002969e7:
        if ((_Var9._M_i == 0x3a) &&
           (bVar2 = hasRegisteredConverterFunction(fromType,(QMetaType)0x6be8c8), bVar2))
        goto LAB_00296923;
      }
      if ((fromType.d_ptr == (QMetaTypeInterface *)0x0) || (((fromType.d_ptr)->flags & 0x10) == 0))
      {
        if ((toType.d_ptr == (QMetaTypeInterface *)0x0) || (((toType.d_ptr)->flags & 0x10) == 0)) {
          if ((_Var9._M_i != 0x33 || fromType.d_ptr == (QMetaTypeInterface *)0x0) ||
             (((fromType.d_ptr)->flags & 0x800) == 0)) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              bVar1 = canConvertMetaObject(fromType,toType);
              return bVar1;
            }
            goto LAB_00296ac3;
          }
          goto LAB_00296923;
        }
        if ((uVar3 == 10) || (uVar3 == 0xc)) goto LAB_00296923;
        QMetaType(&local_48,4);
        toType.d_ptr = local_48.d_ptr;
      }
      else {
        if ((_Var9._M_i == 10) || (_Var9._M_i == 0xc)) goto LAB_00296923;
        QMetaType(&local_40,4);
        fromType.d_ptr = local_40.d_ptr;
      }
      bVar1 = canConvert(fromType,toType);
      goto LAB_00296923;
    }
    if (fromType.d_ptr == (QMetaTypeInterface *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar5 == 0) {
        iVar5 = registerHelper(fromType.d_ptr);
      }
    }
    toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType;
    if ((iVar5 - 9U < 0x29) &&
       (toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType,
       (0x1000000000fU >> ((ulong)(iVar5 - 9U) & 0x3f) & 1) != 0)) {
LAB_00296923:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar1;
      }
LAB_00296ac3:
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

bool QMetaType::canConvert(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    if (fromTypeId == toTypeId)
        return true;

    if (auto moduleHelper = qModuleHelperForType(qMax(fromTypeId, toTypeId))) {
        if (moduleHelper->convert(nullptr, fromTypeId, nullptr, toTypeId))
            return true;
    }
    const ConverterFunction * const f =
        customTypesConversionRegistry()->function(std::make_pair(fromTypeId, toTypeId));
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canConvertToSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canConvertToAssociativeIterable(fromType);
    if (toTypeId == QVariantList
            && canConvert(fromType, QMetaType::fromType<QSequentialIterable>())) {
        return true;
    }

    if ((toTypeId == QVariantHash || toTypeId == QVariantMap)
            && canConvert(fromType, QMetaType::fromType<QAssociativeIterable>())) {
        return true;
    }

    if (toTypeId == QVariantPair && hasRegisteredConverterFunction(
                    fromType, QMetaType::fromType<QtMetaTypePrivate::QPairVariantInterfaceImpl>()))
        return true;

    if (fromType.flags() & IsEnumeration) {
        if (toTypeId == QString || toTypeId == QByteArray)
            return true;
        return canConvert(QMetaType(LongLong), toType);
    }
    if (toType.flags() & IsEnumeration) {
        if (fromTypeId == QString || fromTypeId == QByteArray)
            return true;
        return canConvert(fromType, QMetaType(LongLong));
    }
    if (toTypeId == Nullptr && fromType.flags() & IsPointer)
        return true;
    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}